

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.h
# Opt level: O3

void __thiscall CoreML::Specification::StringVector::add_vector(StringVector *this,char *value)

{
  int iVar1;
  Arena *this_00;
  char *pcVar2;
  LogMessage *other;
  long *elem;
  int iVar3;
  Rep *pRVar4;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (value == (char *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/src/../build/format/DataStructures.pb.h"
               ,0x511);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: value != NULL: ");
    google::protobuf::internal::LogFinisher::operator=(&local_61,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  pRVar4 = (this->vector_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
    iVar3 = (this->vector_).super_RepeatedPtrFieldBase.total_size_;
LAB_0018e382:
    google::protobuf::internal::RepeatedPtrFieldBase::Reserve
              (&(this->vector_).super_RepeatedPtrFieldBase,iVar3 + 1);
    pRVar4 = (this->vector_).super_RepeatedPtrFieldBase.rep_;
    iVar3 = pRVar4->allocated_size;
  }
  else {
    iVar1 = (this->vector_).super_RepeatedPtrFieldBase.current_size_;
    iVar3 = pRVar4->allocated_size;
    if (iVar1 < iVar3) {
      (this->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      elem = (long *)pRVar4->elements[iVar1];
      goto LAB_0018e416;
    }
    if (iVar3 == (this->vector_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0018e382;
  }
  pRVar4->allocated_size = iVar3 + 1;
  this_00 = (this->vector_).super_RepeatedPtrFieldBase.arena_;
  if (this_00 == (Arena *)0x0) {
    elem = (long *)operator_new(0x20);
    *elem = (long)(elem + 2);
    elem[1] = 0;
    *(undefined1 *)(elem + 2) = 0;
  }
  else {
    elem = (long *)google::protobuf::Arena::AllocateAligned
                             (this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    *elem = (long)(elem + 2);
    elem[1] = 0;
    *(undefined1 *)(elem + 2) = 0;
    google::protobuf::Arena::AddListNode
              (this_00,elem,google::protobuf::internal::arena_destruct_object<std::__cxx11::string>)
    ;
    pRVar4 = (this->vector_).super_RepeatedPtrFieldBase.rep_;
  }
  iVar3 = (this->vector_).super_RepeatedPtrFieldBase.current_size_;
  (this->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
  pRVar4->elements[iVar3] = elem;
LAB_0018e416:
  pcVar2 = (char *)elem[1];
  strlen(value);
  std::__cxx11::string::_M_replace((ulong)elem,0,pcVar2,(ulong)value);
  return;
}

Assistant:

inline void StringVector::add_vector(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  vector_.Add()->assign(value);
  // @@protoc_insertion_point(field_add_char:CoreML.Specification.StringVector.vector)
}